

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sorted-usec-list.c
# Opt level: O0

lws_usec_t lws_sul_nonmonotonic_adjust(lws_context *ctx,int64_t step_us)

{
  lws_sorted_usec_list_t *sul;
  lws_dll2 *p;
  int m;
  int n;
  lws_context_per_thread *pt;
  int64_t step_us_local;
  lws_context *ctx_local;
  
  _m = ctx->pt;
  for (p._0_4_ = 0; (int)p < (int)(uint)ctx->count_threads; p._0_4_ = (int)p + 1) {
    for (p._4_4_ = 0; p._4_4_ < 2; p._4_4_ = p._4_4_ + 1) {
      if (_m->pt_sul_owner[p._4_4_].count != 0) {
        for (sul = (lws_sorted_usec_list_t *)lws_dll2_get_head(_m->pt_sul_owner + p._4_4_);
            sul != (lws_sorted_usec_list_t *)0x0; sul = (lws_sorted_usec_list_t *)(sul->list).next)
        {
          sul->us = step_us + sul->us;
        }
      }
    }
    _m = _m + 1;
  }
  return 0;
}

Assistant:

lws_usec_t
lws_sul_nonmonotonic_adjust(struct lws_context *ctx, int64_t step_us)
{
	struct lws_context_per_thread *pt = &ctx->pt[0];
	int n, m;

	/*
	 * for each pt
	 */

	for (m = 0; m < ctx->count_threads; m++) {

		/*
		 * For each owning list...
		 */

		lws_pt_lock(pt, __func__);

		for (n = 0; n < LWS_COUNT_PT_SUL_OWNERS; n++) {

			if (!pt->pt_sul_owner[n].count)
				continue;

			/* ... and for every existing sul on a list... */

			lws_start_foreach_dll(struct lws_dll2 *, p,
					      lws_dll2_get_head(
							&pt->pt_sul_owner[n])) {
				lws_sorted_usec_list_t *sul = lws_container_of(
					       p, lws_sorted_usec_list_t, list);

				/*
				 * ... retrospectively step its ripe time by the
				 * step we will adjust the gettimeofday() clock
				 * with
				 */

				sul->us += step_us;

			} lws_end_foreach_dll(p);
		}

		lws_pt_unlock(pt);

		pt++;
	}

	return 0;
}